

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsharedmemory_systemv.cpp
# Opt level: O1

bool __thiscall
QSharedMemorySystemV::create(QSharedMemorySystemV *this,QSharedMemoryPrivate *self,qsizetype size)

{
  bool bVar1;
  int iVar2;
  key_t kVar3;
  int iVar4;
  int *piVar5;
  char *pcVar6;
  long in_FS_OFFSET;
  QLatin1StringView function;
  QAnyStringView a;
  QAnyStringView a_00;
  QString local_60;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  updateNativeKeyFile(this,&self->nativeKey);
  pcVar6 = (this->nativeKeyFile).d.ptr;
  if (pcVar6 == (char *)0x0) {
    pcVar6 = "";
  }
  do {
    iVar2 = open64(pcVar6,0x800c2,0x1a0);
    if (iVar2 != -1) break;
    piVar5 = __errno_location();
  } while (*piVar5 == 4);
  if (iVar2 < 0) {
    piVar5 = __errno_location();
    iVar2 = -(uint)(*piVar5 != 0x11);
  }
  else {
    close(iVar2);
    iVar2 = 1;
  }
  if (iVar2 == -1) {
    QMetaObject::tr(&local_60,&QSharedMemory::staticMetaObject,"%1: unable to make key",(char *)0x0,
                    -1);
    a_00.m_size = 0x4000000000000016;
    a_00.field_0.m_data_utf8 = "QSharedMemory::handle:";
    QString::arg_impl(&local_48,&local_60,a_00,0,(QChar)0x20);
    self->error = KeyError;
    QString::operator=(&self->errorString,&local_48);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  else {
    kVar3 = handle(this,self);
    if (kVar3 == 0) {
      if (iVar2 == 1) {
LAB_004aaa37:
        pcVar6 = (this->nativeKeyFile).d.ptr;
        if (pcVar6 == (char *)0x0) {
          pcVar6 = "";
        }
        unlink(pcVar6);
      }
    }
    else {
      iVar4 = shmget(this->unix_key,size,0x780);
      bVar1 = true;
      if (iVar4 != -1) goto LAB_004aaa4e;
      piVar5 = __errno_location();
      if (*piVar5 == 0x16) {
        QMetaObject::tr(&local_60,&QSharedMemory::staticMetaObject,
                        "%1: system-imposed size restrictions",(char *)0x0,-1);
        a.m_size = 0x4000000000000015;
        a.field_0.m_data_utf8 = "QSharedMemory::handle";
        QString::arg_impl(&local_48,&local_60,a,0,(QChar)0x20);
        self->error = InvalidSize;
        QString::operator=(&self->errorString,&local_48);
        if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      else {
        function.m_data = "QSharedMemory::create";
        function.m_size = 0x15;
        QSharedMemoryPrivate::setUnixErrorString(self,function);
      }
      if ((iVar2 == 1) && (self->error != AlreadyExists)) goto LAB_004aaa37;
    }
  }
  bVar1 = false;
LAB_004aaa4e:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

bool QSharedMemorySystemV::create(QSharedMemoryPrivate *self, qsizetype size)
{
    // build file if needed
    bool createdFile = false;
    updateNativeKeyFile(self->nativeKey);
    int built = createUnixKeyFile(nativeKeyFile);
    if (built == -1) {
        self->setError(QSharedMemory::KeyError,
                       QSharedMemory::tr("%1: unable to make key")
                       .arg("QSharedMemory::handle:"_L1));
        return false;
    }
    if (built == 1) {
        createdFile = true;
    }

    // get handle
    if (!handle(self)) {
        if (createdFile)
            unlink(nativeKeyFile);
        return false;
    }

    // create
    if (-1 == shmget(unix_key, size_t(size), 0600 | IPC_CREAT | IPC_EXCL)) {
        const auto function = "QSharedMemory::create"_L1;
        switch (errno) {
        case EINVAL:
            self->setError(QSharedMemory::InvalidSize,
                           QSharedMemory::tr("%1: system-imposed size restrictions")
                           .arg("QSharedMemory::handle"_L1));
            break;
        default:
            self->setUnixErrorString(function);
        }
        if (createdFile && self->error != QSharedMemory::AlreadyExists)
            unlink(nativeKeyFile);
        return false;
    }

    return true;
}